

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_ci.cpp
# Opt level: O1

void msd_ci<unsigned_short>(uchar **strings,size_t n,size_t depth)

{
  ushort uVar1;
  uchar *puVar2;
  uchar *puVar3;
  int iVar4;
  uint uVar5;
  void *__ptr;
  size_t i_1;
  uchar **ppuVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uchar **ppuVar10;
  ulong uVar11;
  byte bVar12;
  byte bVar13;
  size_t i;
  size_t sVar14;
  ulong uVar15;
  size_t i_3;
  unsigned_short bucketsize [256];
  ushort local_228 [256];
  
  if (n < 0x20) {
    if (1 < (long)n) {
      ppuVar6 = strings;
      do {
        iVar4 = (int)n;
        n = (size_t)(iVar4 - 1);
        puVar2 = ppuVar6[1];
        ppuVar6 = ppuVar6 + 1;
        for (ppuVar10 = ppuVar6; strings < ppuVar10; ppuVar10 = ppuVar10 + -1) {
          puVar3 = ppuVar10[-1];
          bVar12 = puVar3[depth];
          bVar13 = puVar2[depth];
          if ((bVar12 != 0) && (lVar8 = depth + 1, bVar12 == bVar13)) {
            do {
              bVar12 = puVar3[lVar8];
              bVar13 = puVar2[lVar8];
              if (bVar12 == 0) break;
              lVar8 = lVar8 + 1;
            } while (bVar12 == bVar13);
          }
          if (bVar12 <= bVar13) break;
          *ppuVar10 = puVar3;
        }
        *ppuVar10 = puVar2;
      } while (2 < iVar4);
    }
  }
  else {
    sVar14 = 0;
    memset(local_228,0,0x200);
    __ptr = malloc(n);
    do {
      *(uchar *)((long)__ptr + sVar14) = strings[sVar14][depth];
      sVar14 = sVar14 + 1;
    } while (n != sVar14);
    sVar14 = 0;
    do {
      local_228[*(byte *)((long)__ptr + sVar14)] = local_228[*(byte *)((long)__ptr + sVar14)] + 1;
      sVar14 = sVar14 + 1;
    } while (n != sVar14);
    uVar7 = (uint)local_228[0];
    uVar15 = (ulong)local_228[0];
    lVar8 = 1;
    uVar11 = uVar15;
    msd_ci<unsigned_short>::bucketindex[0] = uVar15;
    do {
      uVar1 = local_228[lVar8];
      uVar11 = uVar11 + uVar1;
      uVar5 = (uint)uVar1;
      if ((ulong)uVar1 == 0) {
        uVar5 = uVar7;
      }
      uVar7 = uVar5;
      msd_ci<unsigned_short>::bucketindex[lVar8] = uVar11;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
    if (n != uVar7) {
      uVar11 = 0;
      do {
        puVar2 = strings[uVar11];
        bVar12 = *(byte *)((long)__ptr + uVar11);
        uVar9 = (ulong)bVar12;
        lVar8 = msd_ci<unsigned_short>::bucketindex[uVar9] + -1;
        msd_ci<unsigned_short>::bucketindex[uVar9] = lVar8;
        while ((long)uVar11 < lVar8) {
          puVar3 = strings[lVar8];
          bVar13 = *(byte *)((long)__ptr + lVar8);
          uVar9 = (ulong)bVar13;
          strings[lVar8] = puVar2;
          *(byte *)((long)__ptr + lVar8) = bVar12;
          lVar8 = msd_ci<unsigned_short>::bucketindex[uVar9] + -1;
          msd_ci<unsigned_short>::bucketindex[uVar9] = lVar8;
          puVar2 = puVar3;
          bVar12 = bVar13;
        }
        strings[uVar11] = puVar2;
        uVar11 = uVar11 + local_228[uVar9];
      } while (uVar11 < n - uVar7);
    }
    free(__ptr);
    lVar8 = 1;
    do {
      uVar11 = (ulong)local_228[lVar8];
      if (uVar11 != 0) {
        msd_ci<unsigned_short>(strings + uVar15,uVar11,depth + 1);
        uVar15 = uVar15 + uVar11;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 0x100);
  }
  return;
}

Assistant:

static void
msd_ci(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	BucketsizeType bucketsize[256] = {0};
	unsigned char* restrict oracle =
		(unsigned char*) malloc(n);
	for (size_t i=0; i < n; ++i)
		oracle[i] = strings[i][depth];
	for (size_t i=0; i < n; ++i)
		++bucketsize[oracle[i]];
	static ssize_t bucketindex[256];
	bucketindex[0] = bucketsize[0];
	BucketsizeType last_bucket_size = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		bucketindex[i] = bucketindex[i-1] + bucketsize[i];
		if (bucketsize[i]) last_bucket_size = bucketsize[i];
	}
	for (size_t i=0; i < n-last_bucket_size; ) {
		distblock<uint8_t> tmp = { strings[i], oracle[i] };
		while (1) {
			// Continue until the current bucket is completely in
			// place
			if (--bucketindex[tmp.bucket] <= ssize_t(i))
				break;
			// backup all information of the position we are about
			// to overwrite
			size_t backup_idx = bucketindex[tmp.bucket];
			distblock<uint8_t> tmp2 = { strings[backup_idx], oracle[backup_idx] };
			// overwrite everything, ie. move the string to correct
			// position
			strings[backup_idx] = tmp.ptr;
			oracle[backup_idx]  = tmp.bucket;
			tmp = tmp2;
		}
		// Commit last pointer to place. We don't need to copy the
		// oracle entry, it's not read after this.
		strings[i] = tmp.ptr;
		i += bucketsize[tmp.bucket];
	}
	free(oracle);
	size_t bsum = bucketsize[0];
	for (size_t i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_ci<BucketsizeType>(strings+bsum, bucketsize[i], depth+1);
		bsum += bucketsize[i];
	}
}